

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayout::separatorRect(QDockAreaLayout *this,int index)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *dock;
  QRect r;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x577f6d);
  if (bVar3) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  else {
    switch(in_ESI) {
    case 0:
      QRect::right((QRect *)0x577fcf);
      QRect::top((QRect *)0x577fe0);
      QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                   in_stack_ffffffffffffff78);
      break;
    case 1:
      QRect::left((QRect *)0x578027);
      QRect::top((QRect *)0x578040);
      QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                   in_stack_ffffffffffffff78);
      break;
    case 2:
      QRect::left((QRect *)0x578087);
      QRect::bottom((QRect *)0x578095);
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                   in_stack_ffffffffffffff78);
      break;
    case 3:
      iVar4 = QRect::left((QRect *)0x5780d2);
      iVar5 = QRect::top((QRect *)0x5780e0);
      iVar5 = iVar5 - *(int *)(in_RDI + 0x200);
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QRect::QRect((QRect *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffff84,
                   in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      break;
    default:
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = (int)local_10;
  QVar2._0_8_ = local_18;
  QVar2.y2.m_i = (int)((ulong)local_10 >> 0x20);
  return QVar2;
}

Assistant:

QRect QDockAreaLayout::separatorRect(int index) const
{
    const QDockAreaLayoutInfo &dock = docks[index];
    if (dock.isEmpty())
        return QRect();
    QRect r = dock.rect;
    switch (index) {
        case QInternal::LeftDock:
            return QRect(r.right() + 1, r.top(), sep, r.height());
        case QInternal::RightDock:
            return QRect(r.left() - sep, r.top(), sep, r.height());
        case QInternal::TopDock:
            return QRect(r.left(), r.bottom() + 1, r.width(), sep);
        case QInternal::BottomDock:
            return QRect(r.left(), r.top() - sep, r.width(), sep);
        default:
            break;
    }
    return QRect();
}